

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType __thiscall ValueType::ToDefinitePrimitiveSubset(ValueType *this)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  Bits BVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar5;
  undefined4 *puVar6;
  Bits BVar7;
  
  BVar7 = (this->field_0).bits;
  BVar4 = Null|Undefined;
  if ((BVar7 & Object) == 0) {
    BVar4 = Simd|PrimitiveOrObject|Symbol|String|Boolean|Number|Float|Int|Null|Undefined;
  }
  if ((BVar4 & BVar7) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3dd,"(HasBeenPrimitive())","HasBeenPrimitive()");
    if (!bVar2) goto LAB_009f3fae;
    *puVar6 = 0;
    BVar7 = (this->field_0).bits;
  }
  if ((BVar7 & (PrimitiveOrObject|Object)) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3de,"(HasBeenObject())","HasBeenObject()");
    if (!bVar2) {
LAB_009f3fae:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    BVar7 = (this->field_0).bits;
  }
  BVar4 = Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
          CanBeTaggedValue|Null|Undefined;
  if ((BVar7 & Object) != 0) {
    bVar2 = IsLikelyPrimitive(this);
    BVar7 = (this->field_0).bits;
    if (bVar2) {
      VVar3 = ToDefiniteObject(this);
      BVar4 = (ushort)VVar3.field_0 | BVar7 & (Null|Undefined);
      goto LAB_009f3fa2;
    }
    BVar4 = CanBeTaggedValue|Null|Undefined;
    if ((BVar7 & Object) == 0) {
      BVar4 = Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
              CanBeTaggedValue|Null|Undefined;
    }
  }
  BVar4 = BVar4 & BVar7;
LAB_009f3fa2:
  aVar5.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(BVar4);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar5.field_0;
}

Assistant:

ValueType ValueType::ToDefinitePrimitiveSubset() const
{
    // This function does not do a safe conversion of an arbitrary type to a definitely-primitive type. It only obtains the
    // primitive subset of bits from the type.

    // When Undefined (or Null) merge with Object, the resulting value type is still likely Object (IsLikelyObject() returns
    // true). ToDefinite() on the merged type would return a type that is definitely Undefined or Object. Usually, that type is
    // not interesting and a test for one or more of the primitive types may have been done. ToDefinitePrimitive() removes the
    // object-specific bits.

    Assert(HasBeenPrimitive());
    Assert(HasBeenObject());

    // If we have an object format of a type (object bit = 1) that represents a primitive (e.g. SIMD128),
    // we want to keep the object bit and type along with other merged primitives (Undefined and/or Null).
    if (IsLikelyObject() && IsLikelyPrimitive())
        return Verify(bits & (Bits::Undefined | Bits::Null) | ToDefiniteObject().bits);

    return
        Verify(
        bits &
        (
            OneOn(Bits::Object)
                ?
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT) - (Bits::Likely | Bits::Object)
                    :
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT + VALUE_TYPE_NONOBJECT_BIT_COUNT) -
                        (Bits::Likely | Bits::Object | Bits::PrimitiveOrObject)
            ));
}